

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

void __thiscall rsg::VariableManager::declareVariable(VariableManager *this,Variable *variable)

{
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  __position;
  pointer ppVVar1;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                         ((this->m_entryCache).
                          super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->m_entryCache).
                          super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  if (__position._M_current !=
      (this->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::erase
              (&this->m_entryCache,(const_iterator)__position._M_current);
  }
  for (ppVVar1 = (this->m_valueScopeStack).
                 super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar1 !=
      (this->m_valueScopeStack).
      super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar1 = ppVVar1 + 1) {
    ValueScope::removeValue(*ppVVar1,variable);
  }
  VariableScope::declare
            ((this->m_variableScopeStack).
             super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl
             .super__Vector_impl_data._M_finish[-1],variable);
  return;
}

Assistant:

void VariableManager::declareVariable (Variable* variable)
{
	// Remove from cache if exists in there.
	std::vector<const ValueEntry*>::iterator pos = std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable));
	if (pos != m_entryCache.end())
		m_entryCache.erase(pos);

	DE_ASSERT(std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable)) == m_entryCache.end());

	// Remove from scope stack.
	for (vector<ValueScope*>::const_iterator stackIter = m_valueScopeStack.begin(); stackIter != m_valueScopeStack.end(); stackIter++)
	{
		ValueScope* scope = *stackIter;
		scope->removeValue(variable);
	}

	// Declare in current scope.
	getCurVariableScope().declare(variable);
}